

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelRead.cpp
# Opt level: O0

expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *
idx2::ParallelReadChunkExponents
          (expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *__return_storage_ptr__,
          idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband)

{
  int iVar1;
  long lVar2;
  __syscall_slong_t _Var3;
  bool bVar4;
  ulong uVar5;
  bitstream *Output;
  allocator *Alloc;
  unsigned_long *Key;
  error<idx2::idx2_err_code> eVar6;
  error<idx2::idx2_err_code> eVar7;
  byte local_3a1;
  undefined1 local_338 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:370:5)>
  __ScopeGuard__370;
  anon_class_8_1_a0eb12ef_for_Func __CleanUpFunc__370;
  buffer CompressedChunkExpsBuf;
  bitstream *ChunkExpStream;
  i32 PrevChunkOffset;
  i32 ChunkExpSize;
  i64 ChunkExpOffset;
  i32 ChunkPos;
  undefined2 local_2e0;
  bool bStack_2de;
  anon_class_8_1_1e916d15 local_2d8;
  cstr local_2d0;
  undefined2 local_2c8;
  undefined1 uStack_2c6;
  undefined5 uStack_2c5;
  undefined1 local_2c0 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:356:5)>
  __ScopeGuard__356;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__356;
  FILE *Fp;
  timer IOTimer;
  chunk_exp_cache *ChunkExpCache;
  undefined2 local_280;
  bool bStack_27e;
  anon_class_1_0_00000001 local_271;
  cstr local_270;
  undefined2 local_268;
  undefined1 uStack_266;
  undefined5 uStack_265;
  iterator local_260;
  unsigned_long *local_240;
  iterator ChunkCacheIt;
  file_cache *FileCache;
  u64 ChunkAddress;
  error<idx2::idx2_err_code> local_208;
  anon_class_8_1_1e916d15 local_1f8;
  allocator *local_1f0;
  undefined2 local_1e8;
  undefined1 uStack_1e6;
  undefined5 uStack_1e5;
  undefined7 local_1e0;
  undefined4 uStack_1d9;
  undefined5 uStack_1d5;
  undefined7 uStack_1d0;
  undefined1 uStack_1c9;
  error<idx2::idx2_err_code> Result;
  iterator FileCacheIt;
  anon_union_8_2_2df48d06_for_stref_0 local_190;
  file_id FileId;
  unique_lock<std::mutex> Lock;
  i8 Subband_local;
  i8 Level_local;
  u64 Brick_local;
  decode_data *D_local;
  idx2_file *Idx2_local;
  undefined1 local_110 [8];
  timespec End;
  i8 I;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&FileId.Id,&D->FileCacheMutex);
  Key = (unsigned_long *)(ulong)(uint)(int)Level;
  ConstructFilePath((file_id *)&local_190,Idx2,Brick,Level,Subband,0);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)&Result.Code,(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)&FileId.Name.Size,Key);
  eVar6 = ParallelReadFileExponents(Idx2,D,Level,(iterator *)&Result.Code,(file_id *)&local_190);
  local_1e0 = eVar6.Msg._0_7_;
  uStack_1d9 = eVar6._7_4_;
  uStack_1d5 = eVar6._11_5_;
  uStack_1d0 = local_1e0;
  _uStack_1c9 = uStack_1d9;
  bVar4 = error::operator_cast_to_bool((error *)&uStack_1d0);
  if ((bVar4) &&
     (*(char *)((long)&(FileCacheIt.Ht)->Keys +
               (long)&(((FileCacheIt.Val)->ChunkOffsets).Buffer.Alloc)->_vptr_allocator) == '\x02'))
  {
    if (0xf < Level) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]")
      ;
    }
    uVar5 = (ulong)(Idx2->BricksPerChunk).Arr[(int)Level];
    if (uVar5 == 0) {
      local_3a1 = 0xff;
    }
    else {
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      local_3a1 = 0x3f - ((byte)lVar2 ^ 0x3f);
    }
    FileCache = (file_cache *)
                (((long)Level << 0x3c) +
                 (Brick >> (local_3a1 + (uVar5 != 1L << (local_3a1 & 0x3f)) & 0x3f)) * 0x40000 +
                (long)((int)Subband << 0xc));
    ChunkCacheIt.Idx = (i64)FileCacheIt.Key;
    Lookup<unsigned_long,idx2::chunk_exp_cache>
              (&local_260,(idx2 *)(FileCacheIt.Key + 0xc),
               (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)&FileCache,(unsigned_long *)0x0);
    local_240 = local_260.Key;
    ChunkCacheIt.Key = (unsigned_long *)local_260.Val;
    ChunkCacheIt.Val = (chunk_exp_cache *)local_260.Ht;
    ChunkCacheIt.Ht = (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)local_260.Idx;
    if (*(char *)((long)(unsigned_long **)local_260.Idx +
                 (((bitstream *)&(local_260.Ht)->Vals)->Stream).Bytes) == '\x02') {
      IOTimer.Start.tv_nsec = (__syscall_slong_t)local_260.Val;
      if (((local_260.Val)->ChunkExpStream).Stream.Bytes == 0) {
        clock_gettime(1,(timespec *)&Fp);
        __CleanUpFunc__356.Fp = (FILE **)fopen(local_190.Ptr,"rb");
        __ScopeGuard__356._8_8_ = &__CleanUpFunc__356;
        scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:356:5)>
        ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:356:5)>
                       *)local_2c0,(anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__356.Dismissed)
        ;
        if (__CleanUpFunc__356.Fp == (FILE **)0x0) {
          local_2d8.FileId = (file_id *)&local_190;
          eVar6 = ParallelReadChunkExponents::anon_class_8_1_1e916d15::operator()(&local_2d8);
          local_2d0 = eVar6.Msg;
          local_2e0 = eVar6._8_2_;
          local_2c8 = local_2e0;
          bStack_2de = eVar6.StrGened;
          uStack_2c6 = bStack_2de;
          __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffad0;
          (__return_storage_ptr__->field_1).Err.Msg = local_2d0;
          (__return_storage_ptr__->field_1).Val.ChunkExpStream.Stream.Data =
               (byte *)CONCAT53(uStack_2c5,eVar6._8_3_);
          __return_storage_ptr__->Ok = false;
          ChunkAddress._4_4_ = 1;
        }
        else {
          iVar1 = *(int *)IOTimer.Start.tv_nsec;
          _PrevChunkOffset = *(long *)(ChunkCacheIt.Idx + 0xc0);
          ChunkExpStream._4_4_ = *(int *)(*(long *)(ChunkCacheIt.Idx + 0x90) + (long)iVar1 * 4);
          if (0 < iVar1) {
            iVar1 = *(int *)(*(long *)(ChunkCacheIt.Idx + 0x90) + (long)(iVar1 + -1) * 4);
            _PrevChunkOffset = iVar1 + _PrevChunkOffset;
            ChunkExpStream._4_4_ = ChunkExpStream._4_4_ - iVar1;
          }
          fseeko((FILE *)__CleanUpFunc__356.Fp,_PrevChunkOffset,0);
          _Var3 = IOTimer.Start.tv_nsec;
          Output = (bitstream *)(IOTimer.Start.tv_nsec + 8);
          Mallocator();
          __CleanUpFunc__370.CompressedChunkExpsBuf = (buffer *)0x0;
          __ScopeGuard__370._8_8_ = &__CleanUpFunc__370;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:370:5)>
          ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:370:5)>
                         *)local_338,
                        (anon_class_8_1_a0eb12ef_for_Func *)&__ScopeGuard__370.Dismissed);
          Alloc = &Mallocator()->super_allocator;
          AllocBuf((buffer *)&__CleanUpFunc__370,(long)ChunkExpStream._4_4_,Alloc);
          fread(__CleanUpFunc__370.CompressedChunkExpsBuf,(long)ChunkExpStream._4_4_,1,
                (FILE *)__CleanUpFunc__356.Fp);
          DecompressBufZstd((buffer *)&__CleanUpFunc__370,Output);
          std::__atomic_base<unsigned_long>::operator+=
                    (&(D->BytesDecoded_).super___atomic_base<unsigned_long>,
                     (long)ChunkExpStream._4_4_);
          std::__atomic_base<unsigned_long>::operator+=
                    (&(D->BytesExps_).super___atomic_base<unsigned_long>,(long)ChunkExpStream._4_4_)
          ;
          End.tv_nsec = (__syscall_slong_t)&Fp;
          clock_gettime(1,(timespec *)local_110);
          std::__atomic_base<unsigned_long>::operator+=
                    (&(D->DecodeIOTime_).super___atomic_base<unsigned_long>,
                     (long)((double)((long)local_110 - *(long *)End.tv_nsec) * 1000000000.0 +
                           (double)(End.tv_sec - *(long *)(End.tv_nsec + 8))));
          (Output->Stream).Data = (Output->Stream).Data;
          *(undefined8 *)(_Var3 + 0x10) = *(undefined8 *)(_Var3 + 0x10);
          *(undefined8 *)(_Var3 + 0x18) = *(undefined8 *)(_Var3 + 0x18);
          *(byte **)(_Var3 + 0x20) = (Output->Stream).Data;
          *(undefined4 *)(_Var3 + 0x30) = 0;
          *(undefined8 *)(_Var3 + 0x28) = 0;
          *(long *)(_Var3 + 0x20) = *(long *)(_Var3 + 0x20) + (long)(*(int *)(_Var3 + 0x30) >> 3);
          *(undefined8 *)(_Var3 + 0x28) = **(undefined8 **)(_Var3 + 0x20);
          *(uint *)(_Var3 + 0x30) = *(uint *)(_Var3 + 0x30) & 7;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:370:5)>
          ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:370:5)>
                          *)local_338);
          ChunkAddress._4_4_ = 0;
        }
        scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:356:5)>
        ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:356:5)>
                        *)local_2c0);
        eVar6.Code = local_208.Code;
        eVar6.StackIdx = local_208.StackIdx;
        eVar6.StrGened = local_208.StrGened;
        eVar6._11_5_ = local_208._11_5_;
        eVar6.Msg = local_208.Msg;
        if (ChunkAddress._4_4_ != 0) goto LAB_00280a54;
      }
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffad0;
      memcpy(&__return_storage_ptr__->field_1,ChunkCacheIt.Key,0x40);
      eVar6.Code = local_208.Code;
      eVar6.StackIdx = local_208.StackIdx;
      eVar6.StrGened = local_208.StrGened;
      eVar6._11_5_ = local_208._11_5_;
      eVar6.Msg = local_208.Msg;
      __return_storage_ptr__->Ok = true;
      ChunkAddress._4_4_ = 1;
    }
    else {
      eVar7 = ParallelReadChunkExponents::anon_class_1_0_00000001::operator()(&local_271);
      eVar6.Code = local_208.Code;
      eVar6.StackIdx = local_208.StackIdx;
      eVar6.StrGened = local_208.StrGened;
      eVar6._11_5_ = local_208._11_5_;
      eVar6.Msg = local_208.Msg;
      local_270 = eVar7.Msg;
      local_280 = eVar7._8_2_;
      local_268 = local_280;
      bStack_27e = eVar7.StrGened;
      uStack_266 = bStack_27e;
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffad0;
      (__return_storage_ptr__->field_1).Err.Msg = local_270;
      (__return_storage_ptr__->field_1).Val.ChunkExpStream.Stream.Data =
           (byte *)CONCAT53(uStack_265,eVar7._8_3_);
      __return_storage_ptr__->Ok = false;
      ChunkAddress._4_4_ = 1;
    }
  }
  else {
    local_1f8.FileId = (file_id *)&local_190;
    eVar6 = ParallelReadChunkExponents::anon_class_8_1_1e916d15::operator()(&local_1f8);
    local_1f0 = (allocator *)eVar6.Msg;
    local_208._8_2_ = eVar6._8_2_;
    local_1e8._0_1_ = local_208.Code;
    local_1e8._1_1_ = local_208.StackIdx;
    local_208.StrGened = eVar6.StrGened;
    uStack_1e6 = local_208.StrGened;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffad0;
    (__return_storage_ptr__->field_1).Err.Msg = (cstr)local_1f0;
    (__return_storage_ptr__->field_1).Val.ChunkExpStream.Stream.Data =
         (byte *)CONCAT53(uStack_1e5,eVar6._8_3_);
    __return_storage_ptr__->Ok = false;
    ChunkAddress._4_4_ = 1;
  }
LAB_00280a54:
  local_208 = eVar6;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&FileId.Id);
  return __return_storage_ptr__;
}

Assistant:

expected<chunk_exp_cache, idx2_err_code>
ParallelReadChunkExponents(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
    auto ChunkExpCacheIt = Lookup(D->FileCache.ChunkExpCaches, ChunkAddress);
    if (ChunkExpCacheIt)
      return *ChunkExpCacheIt.Val;

    // here we release he lock and read the chunk
    // read the block
    buffer buff;
    bool Result = Idx2.external_read(Idx2, buff, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    // decompress the block
    chunk_exp_cache ChunkExpCache;
    bitstream& ChunkExpStream = ChunkExpCache.ChunkExpStream;
    DecompressBufZstd(buff, &ChunkExpStream);
    InitRead(&ChunkExpCache.ChunkExpStream, ChunkExpStream.Stream);
    Insert(&ChunkExpCacheIt, ChunkAddress, ChunkExpCache);
    return *ChunkExpCacheIt.Val;
  }
#endif
  std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  auto Result = ParallelReadFileExponents(Idx2, D, Level, &FileCacheIt, FileId);
  if (!Result || !FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkExpCaches)::iterator ChunkCacheIt;
  // TODO: lock and be careful about invalidated pointer
  ChunkCacheIt = Lookup(FileCache->ChunkExpCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);

  chunk_exp_cache* ChunkExpCache = ChunkCacheIt.Val;
  if (Size(ChunkExpCache->ChunkExpStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkExpCache->ChunkPos;
    i64 ChunkExpOffset = FileCache->ExponentBeginOffset;
    i32 ChunkExpSize = FileCache->ChunkExpOffsets[ChunkPos];
    if (ChunkPos > 0)
    {
      i32 PrevChunkOffset = FileCache->ChunkExpOffsets[ChunkPos - 1];
      ChunkExpOffset += PrevChunkOffset;
      ChunkExpSize -= PrevChunkOffset;
    }
    idx2_FSeek(Fp, ChunkExpOffset, SEEK_SET);
    bitstream& ChunkExpStream = ChunkExpCache->ChunkExpStream;
    idx2_ScopeBuffer(CompressedChunkExpsBuf, ChunkExpSize);
    ReadBuffer(Fp, &CompressedChunkExpsBuf, ChunkExpSize);
    DecompressBufZstd(CompressedChunkExpsBuf, &ChunkExpStream);
    D->BytesDecoded_ += ChunkExpSize;
    D->BytesExps_ += ChunkExpSize;
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    InitRead(&ChunkExpStream, ChunkExpStream.Stream);
  }

  return *ChunkCacheIt.Val;
}